

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PCCompatible.cpp
# Opt level: O3

void __thiscall
PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::flush_output
          (ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0> *this,
          int outputs)

{
  if ((outputs & 2U) != 0) {
    Outputs::Speaker::PullLowpass<Audio::Toggle>::run_for
              (&(this->speaker_).speaker,&(this->speaker_).queue,
               (Cycles)(this->speaker_).cycles_since_update.super_WrappedInt<Cycles>.length_);
    (this->speaker_).cycles_since_update.super_WrappedInt<Cycles>.length_ = 0;
    if ((this->speaker_).queue.actions_.
        super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl
        .super__Vector_impl_data._M_start !=
        (this->speaker_).queue.actions_.
        super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl
        .super__Vector_impl_data._M_finish) {
      std::condition_variable::notify_all();
      return;
    }
  }
  return;
}

Assistant:

void flush_output(int outputs) final {
			if(outputs & Output::Audio) {
				speaker_.update();
				speaker_.queue.perform();
			}
		}